

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O0

InterruptResult * __thiscall
node::KernelNotifications::blockTip
          (KernelNotifications *this,SynchronizationState state,CBlockIndex *index)

{
  string_view source_file;
  bool bVar1;
  long in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  Level in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  CBlockIndex *in_stack_ffffffffffffff48;
  SignalInterrupt *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined2 in_stack_ffffffffffffff5e;
  char *in_stack_ffffffffffffff68;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff78;
  LogFlags in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  undefined2 local_3a [9];
  undefined8 local_28;
  undefined8 local_20;
  ConstevalFormatString<0U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI,
             CONCAT22(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c),
             SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
  CBlockIndex::GetBlockHash(in_stack_ffffffffffffff48);
  *(undefined8 *)(in_RDI + 0x68) = local_28;
  *(undefined8 *)(in_RDI + 0x70) = local_20;
  *(char **)(in_RDI + 0x78) = in_stack_ffffffffffffffe8.fmt;
  *(size_t *)(in_RDI + 0x80) = in_stack_fffffffffffffff0;
  std::condition_variable::notify_all();
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CClientUIInterface::NotifyBlockTip
            ((CClientUIInterface *)in_stack_ffffffffffffff48,
             (SynchronizationState)((ulong)in_stack_ffffffffffffff40 >> 0x20),
             (CBlockIndex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if ((*(int *)(in_RDI + 8) == 0) || (*(int *)(in_RDX + 0x18) < *(int *)(in_RDI + 8))) {
    memset(local_3a,0,2);
    std::variant<std::monostate,_kernel::Interrupted>::variant
              ((variant<std::monostate,_kernel::Interrupted> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    bVar1 = util::SignalInterrupt::operator()(in_stack_ffffffffffffff50);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT26(in_stack_ffffffffffffff5e,
                          CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
                 (char *)in_stack_ffffffffffffff50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT26(in_stack_ffffffffffffff5e,
                          CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
                 (char *)in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff40 = "Failed to send shutdown signal after reaching stop height\n";
      source_file._M_str = pcVar2;
      source_file._M_len = in_stack_fffffffffffffff0;
      LogPrintFormatInternal<>
                (in_stack_00000000,source_file,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 in_stack_000000e0,in_stack_ffffffffffffffe8);
    }
    std::variant<std::monostate,kernel::Interrupted>::
    variant<kernel::Interrupted,void,void,kernel::Interrupted,void>
              ((variant<std::monostate,_kernel::Interrupted> *)in_stack_ffffffffffffff48,
               (Interrupted *)in_stack_ffffffffffffff40);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return (InterruptResult *)
           CONCAT62((int6)((ulong)*(char **)(in_FS_OFFSET + 0x28) >> 0x10),local_3a[0]);
  }
  __stack_chk_fail();
}

Assistant:

kernel::InterruptResult KernelNotifications::blockTip(SynchronizationState state, CBlockIndex& index)
{
    {
        LOCK(m_tip_block_mutex);
        m_tip_block = index.GetBlockHash();
        m_tip_block_cv.notify_all();
    }

    uiInterface.NotifyBlockTip(state, &index);
    if (m_stop_at_height && index.nHeight >= m_stop_at_height) {
        if (!m_shutdown()) {
            LogError("Failed to send shutdown signal after reaching stop height\n");
        }
        return kernel::Interrupted{};
    }
    return {};
}